

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendFuncSeparate
          (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,GLenum sourceRGB,GLenum destinationRGB,GLenum sourceAlpha,GLenum destinationAlpha)

{
  GLenum *pGVar1;
  GLenum *pGVar2;
  GLenum *pGVar3;
  GLenum *pGVar4;
  ulong uVar5;
  code *pcVar6;
  
  if (destinationRGB == destinationAlpha && sourceRGB == sourceAlpha) {
    setBlendFunc(this,sourceRGB,destinationRGB);
    return;
  }
  pGVar4 = this->BlendSourceRGB;
  if ((((*pGVar4 != sourceRGB) || (*this->BlendDestinationRGB != destinationRGB)) ||
      (*this->BlendSourceAlpha != sourceAlpha)) ||
     ((*this->BlendDestinationAlpha != destinationAlpha || (this->BlendFuncInvalid == true)))) {
    pcVar6 = *(code **)&this->Driver->field_0xab8;
    if ((pcVar6 != (code *)0x0) ||
       (pcVar6 = *(code **)&this->Driver->field_0xab0, pcVar6 != (code *)0x0)) {
      (*pcVar6)(sourceRGB,destinationRGB,sourceAlpha,destinationAlpha);
      pGVar4 = this->BlendSourceRGB;
    }
    pGVar1 = this->BlendDestinationRGB;
    pGVar2 = this->BlendSourceAlpha;
    pGVar3 = this->BlendDestinationAlpha;
    for (uVar5 = 0; uVar5 < this->FrameBufferCount; uVar5 = uVar5 + 1) {
      pGVar4[uVar5] = sourceRGB;
      pGVar1[uVar5] = destinationRGB;
      pGVar2[uVar5] = sourceAlpha;
      pGVar3[uVar5] = destinationAlpha;
    }
    this->BlendFuncInvalid = false;
  }
  return;
}

Assistant:

void setBlendFuncSeparate(GLenum sourceRGB, GLenum destinationRGB, GLenum sourceAlpha, GLenum destinationAlpha)
	{
		if (sourceRGB != sourceAlpha || destinationRGB != destinationAlpha) {
			if (BlendSourceRGB[0] != sourceRGB || BlendDestinationRGB[0] != destinationRGB ||
					BlendSourceAlpha[0] != sourceAlpha || BlendDestinationAlpha[0] != destinationAlpha ||
					BlendFuncInvalid) {
				Driver->irrGlBlendFuncSeparate(sourceRGB, destinationRGB, sourceAlpha, destinationAlpha);

				for (GLuint i = 0; i < FrameBufferCount; ++i) {
					BlendSourceRGB[i] = sourceRGB;
					BlendDestinationRGB[i] = destinationRGB;
					BlendSourceAlpha[i] = sourceAlpha;
					BlendDestinationAlpha[i] = destinationAlpha;
				}

				BlendFuncInvalid = false;
			}
		} else {
			setBlendFunc(sourceRGB, destinationRGB);
		}
	}